

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  int *piVar1;
  CURLINFO CVar2;
  writeoutid wVar3;
  uint uVar4;
  curl_slist *pcVar5;
  int iVar6;
  CURLcode CVar7;
  httpmap *m;
  long lVar8;
  httpmap *phVar9;
  char *pcVar10;
  curl_certinfo *pcVar11;
  size_t sVar12;
  char *pcVar13;
  bool bVar14;
  curl_slist **ppcVar15;
  char *local_88;
  per_transfer *local_80;
  char *local_78;
  long version;
  FILE *local_68;
  writeoutvar *local_60;
  long local_58;
  dynbuf buf;
  
  local_88 = (char *)0x0;
  curlx_dyn_init(&buf,0x40000);
  CVar2 = wovar->ci;
  if (CVar2 != CURLINFO_NONE) {
    if (CVar2 == CURLINFO_HTTP_VERSION) {
      version = 0;
      bVar14 = false;
      iVar6 = curl_easy_getinfo(per->curl,0x20002e);
      if (iVar6 == 0) {
        phVar9 = http_version;
        do {
          pcVar10 = phVar9->str;
          if (pcVar10 == (char *)0x0) {
            pcVar10 = (char *)0x0;
            bVar14 = false;
            goto LAB_0011e124;
          }
          piVar1 = &phVar9->num;
          phVar9 = phVar9 + 1;
        } while (version != *piVar1);
        goto LAB_0011e11c;
      }
      pcVar10 = (char *)0x0;
      goto LAB_0011e124;
    }
    iVar6 = curl_easy_getinfo(per->curl,CVar2,&local_88);
    bVar14 = local_88 != (char *)0x0 && iVar6 == 0;
    pcVar13 = (char *)0x0;
    pcVar10 = local_88;
    goto LAB_0011e127;
  }
  wVar3 = wovar->id;
  pcVar13 = (char *)0x0;
  local_80 = per;
  switch(wVar3) {
  case VAR_CERT:
    certinfo(per);
    pcVar11 = per->certinfo;
    if (pcVar11 != (curl_certinfo *)0x0) {
      lVar8 = 0;
      bVar14 = false;
      local_68 = (FILE *)stream;
      local_60 = wovar;
      while ((wovar = local_60, lVar8 < pcVar11->num_of_certs && (!bVar14))) {
        ppcVar15 = pcVar11->certinfo + lVar8;
        local_58 = lVar8;
        while( true ) {
          pcVar5 = *ppcVar15;
          bVar14 = pcVar5 != (curl_slist *)0x0;
          if (pcVar5 == (curl_slist *)0x0) break;
          iVar6 = curl_strnequal(pcVar5->data,"cert:",5);
          pcVar10 = pcVar5->data;
          if (iVar6 != 0) {
            pcVar10 = pcVar10 + 5;
          }
          CVar7 = curlx_dyn_add(&buf,pcVar10);
          if ((CVar7 != CURLE_OK) ||
             (((sVar12 = curlx_dyn_len(&buf), sVar12 != 0 &&
               (pcVar10 = curlx_dyn_ptr(&buf), pcVar10[sVar12 - 1] != '\n')) &&
              (CVar7 = curlx_dyn_addn(&buf,"\n",1), CVar7 != CURLE_OK)))) break;
          ppcVar15 = &pcVar5->next;
        }
        lVar8 = local_58 + 1;
        pcVar11 = local_80->certinfo;
      }
      if (bVar14) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar13 = curlx_dyn_ptr(&buf);
        pcVar10 = "";
        local_88 = "";
        if (pcVar13 != (char *)0x0) {
          pcVar10 = pcVar13;
          local_88 = pcVar13;
        }
      }
      bVar14 = (bool)(bVar14 ^ 1);
      stream = (FILE *)local_68;
      goto LAB_0011e124;
    }
    local_88 = "";
    break;
  default:
    goto switchD_0011de8a_caseD_3;
  case VAR_EFFECTIVE_FILENAME:
    pcVar10 = (per->outs).filename;
    goto LAB_0011e112;
  case VAR_ERRORMSG:
    if (per_result == CURLE_OK) break;
    pcVar10 = per->errorbuffer;
    if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
      pcVar10 = (char *)curl_easy_strerror(per_result);
    }
    goto LAB_0011e11c;
  case VAR_INPUT_URL:
    pcVar10 = per->url;
LAB_0011e112:
    if (pcVar10 == (char *)0x0) break;
LAB_0011e11c:
    bVar14 = true;
    local_88 = pcVar10;
LAB_0011e124:
    pcVar13 = (char *)0x0;
LAB_0011e127:
    if ((bVar14) && (pcVar10 != (char *)0x0)) {
      if (use_json) {
        curl_mfprintf(stream,"\"%s\":",wovar->name);
        jsonWriteString(stream,local_88,false);
      }
      else {
        fputs(pcVar10,(FILE *)stream);
      }
      goto LAB_0011e1aa;
    }
    goto switchD_0011de8a_caseD_3;
  case VAR_INPUT_URLSCHEME:
  case VAR_INPUT_URLUSER:
  case VAR_INPUT_URLPASSWORD:
  case VAR_INPUT_URLOPTIONS:
  case VAR_INPUT_URLHOST:
  case VAR_INPUT_URLPORT:
  case VAR_INPUT_URLPATH:
  case VAR_INPUT_URLQUERY:
  case VAR_INPUT_URLFRAGMENT:
  case VAR_INPUT_URLZONEID:
  case VAR_INPUT_URLESCHEME:
  case VAR_INPUT_URLEUSER:
  case VAR_INPUT_URLEPASSWORD:
  case VAR_INPUT_URLEOPTIONS:
  case VAR_INPUT_URLEHOST:
  case VAR_INPUT_URLEPORT:
  case VAR_INPUT_URLEPATH:
  case VAR_INPUT_URLEQUERY:
  case VAR_INPUT_URLEFRAGMENT:
  case VAR_INPUT_URLEZONEID:
    if ((per->url != (char *)0x0) && (lVar8 = curl_url(), lVar8 != 0)) {
      version = 0;
      local_78 = (char *)0x0;
      if (wVar3 < VAR_INPUT_URLESCHEME) {
        local_78 = per->url;
LAB_0011df56:
        uVar4 = (&UINT_00129a04)[(int)wVar3];
        iVar6 = curl_url_set(lVar8,0,local_78,0x208);
        if (iVar6 == 0) {
          iVar6 = curl_url_get(lVar8,uVar4,&version,1);
          bVar14 = iVar6 == 0;
          if (version == 0 || !bVar14) {
            pcVar10 = (char *)0x0;
          }
          else {
            local_88 = (char *)version;
            bVar14 = true;
            pcVar10 = (char *)version;
          }
        }
        else {
          bVar14 = false;
          pcVar10 = (char *)0x0;
        }
      }
      else {
        bVar14 = false;
        iVar6 = curl_easy_getinfo(per->curl,0x100001,&local_78);
        if (iVar6 == 0) goto LAB_0011df56;
        pcVar10 = (char *)0x0;
      }
      curl_url_cleanup(lVar8);
      pcVar13 = (char *)0x0;
      if (bVar14) {
        pcVar13 = pcVar10;
      }
      goto LAB_0011e127;
    }
  }
  pcVar13 = (char *)0x0;
switchD_0011de8a_caseD_3:
  if (use_json) {
    curl_mfprintf(stream,"\"%s\":null",wovar->name);
  }
LAB_0011e1aa:
  curl_free(pcVar13);
  curlx_dyn_free(&buf);
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;
  const char *freestr = NULL;
  struct dynbuf buf;
  curlx_dyn_init(&buf, 256*1024);

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version)) {
        const struct httpmap *m = &http_version[0];
        while(m->str) {
          if(m->num == version) {
            strinfo = m->str;
            valid = true;
            break;
          }
          m++;
        }
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_CERT:
      certinfo(per);
      if(per->certinfo) {
        int i;
        bool error = FALSE;
        for(i = 0; (i < per->certinfo->num_of_certs) && !error; i++) {
          struct curl_slist *slist;

          for(slist = per->certinfo->certinfo[i]; slist; slist = slist->next) {
            size_t len;
            if(curl_strnequal(slist->data, "cert:", 5)) {
              if(curlx_dyn_add(&buf, &slist->data[5])) {
                error = TRUE;
                break;
              }
            }
            else {
              if(curlx_dyn_add(&buf, slist->data)) {
                error = TRUE;
                break;
              }
            }
            len = curlx_dyn_len(&buf);
            if(len) {
              char *ptr = curlx_dyn_ptr(&buf);
              if(ptr[len -1] != '\n') {
                /* add a newline to make things look better */
                if(curlx_dyn_addn(&buf, "\n", 1)) {
                  error = TRUE;
                  break;
                }
              }
            }
          }
        }
        if(!error) {
          strinfo = curlx_dyn_ptr(&buf);
          if(!strinfo)
            /* maybe not a TLS protocol */
            strinfo = "";
          valid = true;
        }
      }
      else
        strinfo = ""; /* no cert info */
      break;
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = (per->errorbuffer && per->errorbuffer[0]) ?
          per->errorbuffer : curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->url) {
        strinfo = per->url;
        valid = true;
      }
      break;
    case VAR_INPUT_URLSCHEME:
    case VAR_INPUT_URLUSER:
    case VAR_INPUT_URLPASSWORD:
    case VAR_INPUT_URLOPTIONS:
    case VAR_INPUT_URLHOST:
    case VAR_INPUT_URLPORT:
    case VAR_INPUT_URLPATH:
    case VAR_INPUT_URLQUERY:
    case VAR_INPUT_URLFRAGMENT:
    case VAR_INPUT_URLZONEID:
    case VAR_INPUT_URLESCHEME:
    case VAR_INPUT_URLEUSER:
    case VAR_INPUT_URLEPASSWORD:
    case VAR_INPUT_URLEOPTIONS:
    case VAR_INPUT_URLEHOST:
    case VAR_INPUT_URLEPORT:
    case VAR_INPUT_URLEPATH:
    case VAR_INPUT_URLEQUERY:
    case VAR_INPUT_URLEFRAGMENT:
    case VAR_INPUT_URLEZONEID:
      if(per->url) {
        if(!urlpart(per, wovar->id, &strinfo)) {
          freestr = strinfo;
          valid = true;
        }
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  DEBUGASSERT(!valid || strinfo);
  if(valid && strinfo) {
    if(use_json) {
      fprintf(stream, "\"%s\":", wovar->name);
      jsonWriteString(stream, strinfo, FALSE);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }
  curl_free((char *)CURL_UNCONST(freestr));

  curlx_dyn_free(&buf);
  return 1; /* return 1 if anything was written */
}